

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
                    *this,Index target,Index source)

{
  Column *column;
  Column *this_00;
  reference entry;
  undefined1 local_28 [16];
  Column *curr;
  Index source_local;
  Index target_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
  *this_local;
  
  curr._0_4_ = source;
  curr._4_4_ = target;
  _source_local = this;
  local_28._8_8_ =
       Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
       ::get_column(&this->reducedMatrixR_,target);
  column = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
           ::get_column(&this->reducedMatrixR_,(Index)curr);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
  ::operator+=((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
                *)local_28._8_8_,column);
  this_00 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
            ::get_column(&this->mirrorMatrixU_,(Index)curr);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
  ::get_column(&this->mirrorMatrixU_,curr._4_4_);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
  ::begin((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
           *)local_28);
  entry = boost::intrusive::
          list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>::Matrix_column_tag,_1U>,_false>
          ::operator*((list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>::Matrix_column_tag,_1U>,_false>
                       *)local_28);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
  ::push_back(this_00,entry);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}